

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsDomainGetAllEntities
              (FmsDomain domain,FmsEntityType type,FmsIntType *ent_id_type,void **ents,
              FmsInt *num_ents)

{
  int iVar1;
  
  if (domain == (FmsDomain)0x0) {
    iVar1 = 1;
  }
  else {
    if (type < FMS_NUM_ENTITY_TYPES) {
      if (ent_id_type != (FmsIntType *)0x0) {
        *ent_id_type = domain->side_ids_type[type];
      }
      if (ents != (void **)0x0) {
        *ents = domain->entities[type];
      }
      if (num_ents != (FmsInt *)0x0) {
        *num_ents = domain->num_entities[type];
      }
      return 0;
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int FmsDomainGetAllEntities(FmsDomain domain, FmsEntityType type,
                            FmsIntType *ent_id_type, const void **ents,
                            FmsInt *num_ents) {
  if (!domain) { E_RETURN(1); }
  if (type >= FMS_NUM_ENTITY_TYPES) { E_RETURN(2); }
  if (ent_id_type) { *ent_id_type = domain->side_ids_type[type]; }
  if (ents) { *ents = domain->entities[type]; }
  if (num_ents) { *num_ents = domain->num_entities[type]; }
  return 0;
}